

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileTest.cpp
# Opt level: O2

bool __thiscall FileTest::fillFile(FileTest *this,File *f)

{
  uint uVar1;
  int i;
  int iVar2;
  long lVar3;
  uint uVar4;
  uint8_t buffer [256];
  undefined1 local_118 [256];
  
  for (lVar3 = 0; lVar3 != 0x100; lVar3 = lVar3 + 1) {
    local_118[lVar3] = (char)lVar3;
  }
  uVar1 = 0;
  do {
    uVar4 = uVar1;
    if (uVar4 == 6) break;
    local_118[0] = (undefined1)uVar4;
    iVar2 = (**(code **)(*(long *)f + 0x18))(f,local_118,0x100);
    uVar1 = uVar4 + 1;
  } while (iVar2 == 0x100);
  return 5 < uVar4;
}

Assistant:

bool FileTest::fillFile( File &f )
{
	uint8_t buffer[ 256 ];
	
	for ( int i = 0; i < 256; i++ )
		buffer[ i ] = i;
	
	for ( int i = 0; i < 6; i++ )
	{
		buffer[ 0 ] = i;

		int res = f.write( buffer, 256 );
		
		if ( res != 256 )
			return false;
	}
	return true;
}